

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O2

int sam_hdr_add_PG(SAM_hdr *sh,char *name,...)

{
  size_t __size;
  uint uVar1;
  char in_AL;
  int iVar2;
  void *__dest;
  char *pcVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  ulong uVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  args[0].reg_save_area = local_e8;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = &stack0x00000008;
  args[0].gp_offset = 0x10;
  args[0].fp_offset = 0x30;
  uVar1 = sh->npg_end;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if ((long)(int)uVar1 == 0) {
    pcVar3 = sam_hdr_PG_ID(sh,name);
    iVar2 = sam_hdr_vadd(sh,"PG",args,"ID",pcVar3,"PN",name,0);
    if (iVar2 != -1) {
      return 0;
    }
  }
  else {
    __size = (long)(int)uVar1 * 4;
    __dest = malloc(__size);
    if (__dest == (void *)0x0) {
      return -1;
    }
    memcpy(__dest,sh->pg_end,__size);
    if ((int)uVar1 < 1) {
      uVar1 = 0;
    }
    uVar4 = 0;
    do {
      if (uVar1 == uVar4) {
        free(__dest);
        return 0;
      }
      pcVar3 = sam_hdr_PG_ID(sh,name);
      iVar2 = sam_hdr_vadd(sh,"PG",args,"ID",pcVar3,"PN",name,"PP",
                           sh->pg[*(int *)((long)__dest + uVar4 * 4)].name,0);
      uVar4 = uVar4 + 1;
    } while (iVar2 != -1);
    free(__dest);
  }
  return -1;
}

Assistant:

int sam_hdr_add_PG(SAM_hdr *sh, const char *name, ...) {
    va_list args;
    va_start(args, name);

    if (sh->npg_end) {
	/* Copy ends array to avoid us looping while modifying it */
	int *end = malloc(sh->npg_end * sizeof(int));
	int i, nends = sh->npg_end;

	if (!end)
	    return -1;

	memcpy(end, sh->pg_end, nends * sizeof(*end));

	for (i = 0; i < nends; i++) {
	    if (-1 == sam_hdr_vadd(sh, "PG", args,
				   "ID", sam_hdr_PG_ID(sh, name),
				   "PN", name,
				   "PP", sh->pg[end[i]].name,
				   NULL)) {
		free(end);
		return  -1;
	    }
	}

	free(end);
    } else {
	if (-1 == sam_hdr_vadd(sh, "PG", args,
			       "ID", sam_hdr_PG_ID(sh, name),
			       "PN", name,
			       NULL))
	    return -1;
    }

    //sam_hdr_dump(sh);

    return 0;
}